

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>_>
     *this,int i)

{
  value_type *in_RDI;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *in_stack_ffffffffffffff08;
  value_type *this_00;
  Fad<double> *in_stack_ffffffffffffff40;
  Fad<double> *in_stack_ffffffffffffff48;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  *in_stack_ffffffffffffff58;
  Fad<double> *in_stack_ffffffffffffff60;
  
  this_00 = in_RDI;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::dx
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)in_RDI,
             (int)((ulong)in_RDI >> 0x20));
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>
  ::val((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>
         *)in_stack_ffffffffffffff08);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>
  ::dx((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>
        *)this_00,(int)((ulong)in_RDI >> 0x20));
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::val(in_stack_ffffffffffffff08);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  operator+<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff48,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff40);
  Fad<double>::
  Fad<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_RDI);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_RDI);
  Fad<double>::~Fad(in_RDI);
  Fad<double>::~Fad(in_RDI);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_RDI);
  Fad<double>::~Fad(in_RDI);
  Fad<double>::~Fad(in_RDI);
  return this_00;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}